

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O1

void __thiscall
cnn::LookupParameters::save<boost::archive::text_oarchive>
          (LookupParameters *this,text_oarchive *ar,uint param_2)

{
  long lVar1;
  pointer pTVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  int nv;
  int local_2c;
  
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::Dim>_>::
  get_instance();
  boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)&this->dim);
  local_2c = (int)((ulong)((long)(this->values).
                                 super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->values).
                                super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>(ar,&local_2c);
  pTVar2 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      boost::serialization::
      singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::Tensor>_>::
      get_instance();
      boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)(pTVar2 + uVar3));
      pTVar2 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
              -0x71c71c71c71c71c7;
      bVar5 = uVar4 <= uVar3;
      lVar1 = uVar3 - uVar4;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar5 && lVar1 != 0);
  }
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    ar & dim;
    int nv = values.size();
    ar & nv;
    for (unsigned i = 0; i < values.size(); ++i)
      ar & values[i];
  }